

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O0

bool __thiscall FileReaderLZSS::UncompressBlock(FileReaderLZSS *this)

{
  BYTE BVar1;
  BYTE *pBVar2;
  unsigned_short uVar3;
  byte *__src;
  uint uVar4;
  uint copy;
  BYTE *copyStart;
  BYTE len;
  WORD pos;
  FileReaderLZSS *this_local;
  
  if (((this->Stream).CFlags & 1) == 0) {
    pBVar2 = (this->Stream).In;
    (this->Stream).In = pBVar2 + 1;
    BVar1 = *pBVar2;
    pBVar2 = (this->Stream).InternalBuffer;
    (this->Stream).InternalBuffer = pBVar2 + 1;
    *pBVar2 = BVar1;
    (this->Stream).AvailIn = (this->Stream).AvailIn - 1;
    (this->Stream).InternalOut = (this->Stream).InternalOut + 1;
  }
  else {
    if ((this->Stream).AvailIn < 2) {
      return false;
    }
    (this->Stream).AvailIn = (this->Stream).AvailIn - 2;
    uVar3 = BigShort(*(unsigned_short *)(this->Stream).In);
    copyStart._5_1_ = ((byte)uVar3 & 0xf) + 1;
    uVar4 = (int)(uint)uVar3 >> 4;
    copyStart._6_2_ = (ushort)uVar4;
    (this->Stream).In = (this->Stream).In + 2;
    if (copyStart._5_1_ == 1) {
      (this->Stream).State = STREAM_FINAL;
      return true;
    }
    __src = (this->Stream).InternalBuffer + (-1 - (long)(int)uVar4);
    if (copyStart._6_2_ == 0) {
      memset((this->Stream).InternalBuffer,(uint)*__src,(ulong)copyStart._5_1_);
    }
    else if (uVar4 < copyStart._5_1_) {
      do {
        uVar4 = MIN<unsigned_int>((uint)copyStart._5_1_,copyStart._6_2_ + 1);
        memcpy((this->Stream).InternalBuffer,__src,(ulong)uVar4);
        (this->Stream).InternalBuffer = (this->Stream).InternalBuffer + uVar4;
        (this->Stream).InternalOut = uVar4 + (this->Stream).InternalOut;
        copyStart._5_1_ = copyStart._5_1_ - (char)uVar4;
        copyStart._6_2_ = copyStart._6_2_ + (short)uVar4;
      } while (copyStart._5_1_ != 0);
      copyStart._5_1_ = 0;
    }
    else {
      memcpy((this->Stream).InternalBuffer,__src,(ulong)copyStart._5_1_);
    }
    (this->Stream).InternalOut = (uint)copyStart._5_1_ + (this->Stream).InternalOut;
    (this->Stream).InternalBuffer = (this->Stream).InternalBuffer + (int)(uint)copyStart._5_1_;
  }
  (this->Stream).CFlags = (BYTE)((int)(uint)(this->Stream).CFlags >> 1);
  (this->Stream).Bits = (BYTE)((int)(uint)(this->Stream).Bits >> 1);
  if ((this->Stream).Bits == '\0') {
    (this->Stream).State = STREAM_FLUSH;
  }
  return true;
}

Assistant:

bool UncompressBlock()
	{
		if(Stream.CFlags & 1)
		{
			// Check to see if we have enough input
			if(Stream.AvailIn < 2)
				return false;
			Stream.AvailIn -= 2;

			WORD pos = BigShort(*(WORD*)Stream.In);
			BYTE len = (pos & 0xF)+1;
			pos >>= 4;
			Stream.In += 2;
			if(len == 1)
			{
				// We've reached the end of the stream.
				Stream.State = STREAM_FINAL;
				return true;
			}

			const BYTE* copyStart = Stream.InternalBuffer-pos-1;

			// Complete overlap: Single byte repeated
			if(pos == 0)
				memset(Stream.InternalBuffer, *copyStart, len);
			// No overlap: One copy
			else if(pos >= len)
				memcpy(Stream.InternalBuffer, copyStart, len);
			else
			{
				// Partial overlap: Copy in 2 or 3 chunks.
				do
				{
					unsigned int copy = MIN<unsigned int>(len, pos+1);
					memcpy(Stream.InternalBuffer, copyStart, copy);
					Stream.InternalBuffer += copy;
					Stream.InternalOut += copy;
					len -= copy;
					pos += copy; // Increase our position since we can copy twice as much the next round.
				}
				while(len);
			}

			Stream.InternalOut += len;
			Stream.InternalBuffer += len;
		}
		else
		{
			// Uncompressed byte.
			*Stream.InternalBuffer++ = *Stream.In++;
			--Stream.AvailIn;
			++Stream.InternalOut;
		}

		Stream.CFlags >>= 1;
		Stream.Bits >>= 1;

		// If we're done with this block, flush the output
		if(Stream.Bits == 0)
			Stream.State = STREAM_FLUSH;

		return true;
	}